

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  parasail_result_t *ppVar4;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t size;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  size_t size_00;
  uint local_c8;
  int local_c4;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_scan_cold_8();
  }
  else if (s2Len < 1) {
    parasail_sw_stats_scan_cold_7();
  }
  else if (open < 0) {
    parasail_sw_stats_scan_cold_6();
  }
  else if (gap < 0) {
    parasail_sw_stats_scan_cold_5();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_scan_cold_4();
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        parasail_sw_stats_scan_cold_3();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        parasail_sw_stats_scan_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_stats_scan_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    local_c8 = _s1Len;
    if (matrix->type != 0) {
      local_c8 = matrix->length;
    }
    ppVar4 = parasail_result_new_stats();
    if (ppVar4 != (parasail_result_t *)0x0) {
      ppVar4->flag = ppVar4->flag | 0x1410204;
      size_00 = (size_t)(int)local_c8;
      ptr = parasail_memalign_int(0x10,size_00);
      ptr_00 = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      size = (size_t)(int)(local_c8 + 1);
      ptr_01 = parasail_memalign_int(0x10,size);
      ptr_02 = parasail_memalign_int(0x10,size);
      ptr_03 = parasail_memalign_int(0x10,size);
      ptr_04 = parasail_memalign_int(0x10,size);
      ptr_05 = parasail_memalign_int(0x10,size_00);
      ptr_06 = parasail_memalign_int(0x10,size_00);
      ptr_07 = parasail_memalign_int(0x10,size_00);
      ptr_08 = parasail_memalign_int(0x10,size_00);
      ptr_09 = parasail_memalign_int(0x10,size);
      ptr_10 = parasail_memalign_int(0x10,size);
      ptr_11 = parasail_memalign_int(0x10,size);
      ptr_12 = parasail_memalign_int(0x10,size);
      ptr_13 = parasail_memalign_int(0x10,size_00);
      if (ptr == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_00 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_01 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_02 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_03 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_04 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_05 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_06 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_07 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_08 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_09 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_10 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_11 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_12 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_13 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      uVar13 = (ulong)local_c8;
      if (0 < (int)local_c8) {
        piVar1 = matrix->mapper;
        uVar6 = 0;
        do {
          ptr[uVar6] = piVar1[(byte)_s1[uVar6]];
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
      }
      piVar1 = matrix->mapper;
      uVar6 = 1;
      if (1 < s2Len) {
        uVar6 = (ulong)(uint)s2Len;
      }
      uVar9 = 0;
      do {
        ptr_00[uVar9] = piVar1[(byte)_s2[uVar9]];
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
      *ptr_01 = 0;
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_09 = 0;
      if (0 < (int)local_c8) {
        uVar6 = 0;
        do {
          ptr_01[uVar6 + 1] = 0;
          ptr_02[uVar6 + 1] = 0;
          ptr_03[uVar6 + 1] = 0;
          ptr_04[uVar6 + 1] = 0;
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
      }
      if (0 < (int)local_c8) {
        uVar6 = 0;
        do {
          ptr_05[uVar6] = -0x40000000;
          ptr_06[uVar6] = 0;
          ptr_07[uVar6] = 0;
          ptr_08[uVar6] = 0;
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
      }
      uVar6 = 1;
      if (1 < s2Len) {
        uVar6 = (ulong)(uint)s2Len;
      }
      iVar2 = -0x40000000;
      uVar9 = 0;
      local_6c = local_c8;
      local_60 = 0;
      local_64 = 0;
      local_68 = 0;
      local_c4 = s2Len;
      do {
        if (0 < (int)local_c8) {
          lVar7 = 0;
          do {
            iVar8 = *(int *)((long)ptr_01 + lVar7 + 4) - open;
            iVar11 = *(int *)((long)ptr_05 + lVar7) - gap;
            if (iVar11 < iVar8) {
              *(int *)((long)ptr_05 + lVar7) = iVar8;
              *(undefined4 *)((long)ptr_06 + lVar7) = *(undefined4 *)((long)ptr_02 + lVar7 + 4);
              *(undefined4 *)((long)ptr_07 + lVar7) = *(undefined4 *)((long)ptr_03 + lVar7 + 4);
              *(undefined4 *)((long)ptr_08 + lVar7) = *(undefined4 *)((long)ptr_04 + lVar7 + 4);
            }
            else {
              *(int *)((long)ptr_05 + lVar7) = iVar11;
            }
            *(int *)((long)ptr_08 + lVar7) = *(int *)((long)ptr_08 + lVar7) + 1;
            lVar7 = lVar7 + 4;
          } while (uVar13 * 4 != lVar7);
        }
        *ptr_09 = 0;
        if (0 < (int)local_c8) {
          piVar1 = matrix->matrix;
          uVar10 = 0;
          do {
            if (matrix->type == 0) {
              iVar8 = ptr[uVar10] * matrix->size;
            }
            else {
              iVar8 = matrix->size * (int)uVar10;
            }
            iVar8 = piVar1[(long)iVar8 + (long)ptr_00[uVar9]];
            iVar11 = ptr_01[uVar10] + iVar8;
            ptr_13[uVar10] = (uint)(iVar11 < ptr_05[uVar10]);
            if (iVar11 < ptr_05[uVar10]) {
              ptr_09[uVar10 + 1] = ptr_05[uVar10];
              ptr_10[uVar10 + 1] = ptr_06[uVar10];
              ptr_11[uVar10 + 1] = ptr_07[uVar10];
              iVar8 = ptr_08[uVar10];
            }
            else {
              ptr_09[uVar10 + 1] = iVar11;
              ptr_10[uVar10 + 1] = (uint)(ptr[uVar10] == ptr_00[uVar9]) + ptr_02[uVar10];
              ptr_11[uVar10 + 1] = (uint)(0 < iVar8) + ptr_03[uVar10];
              iVar8 = ptr_04[uVar10] + 1;
            }
            ptr_12[uVar10 + 1] = iVar8;
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
        if (0 < (int)local_c8) {
          iVar5 = -0x40000000;
          uVar10 = 0;
          iVar12 = 0;
          iVar11 = 0;
          iVar8 = 0;
          do {
            iVar3 = iVar5 - gap;
            iVar5 = ptr_09[uVar10];
            if (ptr_09[uVar10] <= iVar3) {
              iVar5 = iVar3;
            }
            if (iVar3 < ptr_01[uVar10]) {
              iVar8 = ptr_02[uVar10];
              iVar11 = ptr_03[uVar10];
              iVar12 = ptr_04[uVar10];
            }
            iVar3 = iVar5 - open;
            iVar12 = iVar12 + 1;
            if (iVar3 < ptr_09[uVar10 + 1]) {
              ptr_01[uVar10 + 1] = ptr_09[uVar10 + 1];
LAB_005524fc:
              ptr_02[uVar10 + 1] = ptr_10[uVar10 + 1];
              ptr_03[uVar10 + 1] = ptr_11[uVar10 + 1];
              iVar3 = ptr_12[uVar10 + 1];
            }
            else {
              ptr_01[uVar10 + 1] = iVar3;
              if ((ptr_09[uVar10 + 1] == iVar3) && (ptr_13[uVar10] == 0)) goto LAB_005524fc;
              ptr_02[uVar10 + 1] = iVar8;
              ptr_03[uVar10 + 1] = iVar11;
              iVar3 = iVar12;
            }
            ptr_04[uVar10 + 1] = iVar3;
            if (ptr_01[uVar10 + 1] < 1) {
              ptr_01[uVar10 + 1] = 0;
              ptr_02[uVar10 + 1] = 0;
              ptr_03[uVar10 + 1] = 0;
              ptr_04[uVar10 + 1] = 0;
            }
            if (iVar2 < ptr_01[uVar10 + 1]) {
              local_68 = ptr_02[uVar10 + 1];
              local_64 = ptr_03[uVar10 + 1];
              local_60 = ptr_04[uVar10 + 1];
              local_6c = (uint)uVar10;
              local_c4 = (int)uVar9;
              iVar2 = ptr_01[uVar10 + 1];
            }
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
        *ptr_01 = 0;
        uVar9 = uVar9 + 1;
        if (uVar9 == uVar6) {
          ppVar4->score = iVar2;
          ppVar4->end_query = local_6c;
          ppVar4->end_ref = local_c4;
          ((ppVar4->field_4).stats)->matches = local_68;
          ((ppVar4->field_4).stats)->similar = local_64;
          ((ppVar4->field_4).stats)->length = local_60;
          parasail_free(ptr_13);
          parasail_free(ptr_12);
          parasail_free(ptr_11);
          parasail_free(ptr_10);
          parasail_free(ptr_09);
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar4;
        }
      } while( true );
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H  = NULL;
    int * restrict HMB = NULL;
    int * restrict HM  = NULL;
    int * restrict HSB = NULL;
    int * restrict HS  = NULL;
    int * restrict HLB = NULL;
    int * restrict HL  = NULL;
    int * restrict E  = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB= NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB= NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB= NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB= NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = 0;
    similar = 0;
    length = 0;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = 0;
        HM[i] = 0;
        HS[i] = 0;
        HL[i] = 0;
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = 0;
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1];
            }
            FtL += 1;
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
            if (0 >= H[i]) {
                H[i] = 0;
                HM[i] = 0;
                HS[i] = 0;
                HL[i] = 0;
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
            /* max value */
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = j;
            }
        }
        H[-1] = 0;
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}